

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

uint __thiscall CCharmapToLocal::get_mapping(CCharmapToLocal *this,wchar_t unicode_char)

{
  uint *puVar1;
  wchar_t in_ESI;
  CCharmapToLocal *in_RDI;
  uint *subtable;
  uint local_4;
  
  puVar1 = get_sub_table(in_RDI,in_ESI);
  if (puVar1 == (uint *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = puVar1[in_ESI & 0xff];
  }
  return local_4;
}

Assistant:

unsigned int get_mapping(wchar_t unicode_char) const
    {
        unsigned int *subtable;

        /* get the mapping table */
        subtable = get_sub_table(unicode_char);

        /* 
         *   If there is no subtable, return the default character, which is
         *   always at offset zero in the translation array; otherwise, use
         *   the low-order 8 bits of the character code as the index into
         *   the subtable and return the value we find there 
         */
        if (subtable == 0)
            return 0;
        else
            return subtable[unicode_char & 0xff];
    }